

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VMContext.cpp
# Opt level: O0

void __thiscall Lodtalk::VMContext::VMContext(VMContext *this)

{
  VMContext *this_local;
  
  std::
  unordered_map<Lodtalk::AbstractClassFactory_*,_unsigned_int,_std::hash<Lodtalk::AbstractClassFactory_*>,_std::equal_to<Lodtalk::AbstractClassFactory_*>,_std::allocator<std::pair<Lodtalk::AbstractClassFactory_*const,_unsigned_int>_>_>
  ::unordered_map(&this->instancedClassFactories);
  std::
  unordered_map<int,_int_(*)(Lodtalk::InterpreterProxy_*),_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int_(*)(Lodtalk::InterpreterProxy_*)>_>_>
  ::unordered_map(&this->numberedPrimitives);
  initialize(this);
  return;
}

Assistant:

VMContext::VMContext()
{
    initialize();
}